

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall
discordpp::Emoji::Emoji
          (Emoji *this,nullable_field<discordpp::Snowflake> *id,
          nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,omittable_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
                *roles,omittable_field<discordpp::User> *user,omittable_field<bool> *require_colons,
          omittable_field<bool> *managed,omittable_field<bool> *animated,
          omittable_field<bool> *available)

{
  nullable_field<discordpp::Snowflake>::nullable_field(&this->id,id);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&this->name,name);
  omittable_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::
  omittable_field(&this->roles,roles);
  omittable_field<discordpp::User>::omittable_field(&this->user,user);
  omittable_field<bool>::omittable_field(&this->require_colons,require_colons);
  omittable_field<bool>::omittable_field(&this->managed,managed);
  omittable_field<bool>::omittable_field(&this->animated,animated);
  omittable_field<bool>::omittable_field(&this->available,available);
  return;
}

Assistant:

Emoji(
        nullable_field<Snowflake> id = uninitialized,
        nullable_field<std::string> name = uninitialized,
        omittable_field<std::vector<Snowflake> > roles = omitted,
        omittable_field<User> user = omitted,
        omittable_field<bool> require_colons = omitted,
        omittable_field<bool> managed = omitted,
        omittable_field<bool> animated = omitted,
        omittable_field<bool> available = omitted
    ):
        id(id),
        name(name),
        roles(roles),
        user(user),
        require_colons(require_colons),
        managed(managed),
        animated(animated),
        available(available)
    {}